

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O0

int __thiscall
ncnn::PriorBox::forward
          (PriorBox *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  float fVar2;
  const_reference pvVar3;
  size_type sVar4;
  float *pfVar5;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar6;
  double dVar7;
  int i_4;
  float *var;
  int i_3;
  float *box_3;
  float ar;
  int p_1;
  float max_size;
  float min_size;
  int k_1;
  float box_h;
  float box_w;
  int j_1;
  float center_y_1;
  float center_x_1;
  float *box_2;
  int i_2;
  Mat *top_blob;
  int num_prior;
  int num_aspect_ratio;
  int num_max_size;
  int num_min_size;
  float step_h;
  float step_w;
  int image_h;
  int image_w;
  int i_1;
  float *box_1;
  float ch_1;
  float cw_1;
  float ratio;
  int p;
  float size;
  float ch;
  float cw;
  float size_1;
  int k;
  int j;
  float center_y;
  float center_x;
  float *box;
  int i;
  Mat *top_blob_1;
  int num_prior_1;
  int num_ratios;
  int num_sizes;
  float step_h_1;
  float step_w_1;
  int h;
  int w;
  Allocator *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  undefined8 in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  int local_1ec;
  undefined4 *local_1e8;
  float local_1dc;
  float local_1d8;
  int local_1d4;
  void *local_1d0;
  uint local_1c8;
  int local_1c4;
  float local_1c0;
  float local_1bc;
  int local_1b8;
  float local_1b4;
  float local_1b0;
  int local_1ac;
  float local_1a8;
  float local_1a4;
  float *local_1a0;
  int local_194;
  reference local_190;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  float local_174;
  float local_170;
  int local_16c;
  int local_168;
  float local_164;
  float local_160;
  int local_15c;
  void *local_158;
  float local_150;
  float local_14c;
  float local_148;
  int local_144;
  float local_140;
  float local_13c;
  float local_138;
  float local_134;
  int local_130;
  int local_12c;
  float local_128;
  float local_124;
  float *local_120;
  int local_114;
  reference local_110;
  int local_104;
  int local_100;
  int local_fc;
  float local_f8;
  float local_f4;
  int local_f0;
  int local_ec;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_e0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_d8;
  int local_c4;
  reference local_c0;
  reference local_b8;
  long *local_b0;
  reference local_a8;
  reference local_a0;
  reference local_98;
  reference local_90;
  long local_88;
  long *local_80;
  long local_78;
  long *local_70;
  long local_68;
  long *local_60;
  long local_58;
  long *local_50;
  undefined8 local_48;
  undefined8 *local_40;
  long local_38;
  long *local_30;
  long *local_18;
  reference local_10;
  reference local_8;
  
  local_e0 = in_RDX;
  local_d8 = in_RSI;
  pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_ec = pvVar3->w;
  pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_d8,0);
  local_f0 = pvVar3->h;
  sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_d8);
  if (((sVar4 == 1) && (*(int *)(in_RDI + 0x1c0) == -0xe9)) && (*(int *)(in_RDI + 0x1c4) == -0xe9))
  {
    local_b0 = (long *)(in_RDI + 0x118);
    bVar6 = true;
    if (*local_b0 != 0) {
      bVar6 = *(long *)(in_RDI + 0x158) * (long)*(int *)(in_RDI + 0x150) == 0;
      local_18 = local_b0;
    }
    if (bVar6) {
      local_f4 = *(float *)(in_RDI + 0x1c8);
      local_f8 = *(float *)(in_RDI + 0x1cc);
      if ((local_f4 == -233.0) && (!NAN(local_f4))) {
        local_f4 = 1.0 / (float)local_ec;
      }
      if ((local_f8 == -233.0) && (!NAN(local_f8))) {
        local_f8 = 1.0 / (float)local_f0;
      }
      local_fc = *(int *)(in_RDI + 0xfc);
      local_100 = *(int *)(in_RDI + 0x18c);
      local_104 = local_fc + -1 + local_100;
      local_110 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_e0,0);
      Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                  (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                  CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                  in_stack_fffffffffffffdd8);
      local_b8 = local_110;
      bVar6 = true;
      if (local_110->data != (void *)0x0) {
        local_10 = local_110;
        bVar6 = local_110->cstep * (long)local_110->c == 0;
      }
      if (!bVar6) {
        for (local_114 = 0; local_114 < local_f0; local_114 = local_114 + 1) {
          local_90 = local_110;
          local_120 = (float *)((long)local_110->data +
                               (long)(local_114 * local_ec * local_104 * 4) * 4);
          local_124 = *(float *)(in_RDI + 0x1d0) * local_f4;
          local_128 = *(float *)(in_RDI + 0x1d0) * local_f8 + (float)local_114 * local_f8;
          for (local_12c = 0; local_12c < local_ec; local_12c = local_12c + 1) {
            for (local_130 = 0; local_130 < local_fc; local_130 = local_130 + 1) {
              local_30 = (long *)(in_RDI + 0xd0);
              local_38 = (long)local_130;
              local_134 = *(float *)(*local_30 + local_38 * 4);
              local_138 = ((local_134 * (float)local_f0) / (float)local_ec) / 2.0;
              local_13c = local_134 / 2.0;
              *local_120 = local_124 - local_138;
              local_120[1] = local_128 - local_13c;
              local_120[2] = local_124 + local_138;
              local_120[3] = local_128 + local_13c;
              local_120 = local_120 + 4;
            }
            local_40 = (undefined8 *)(in_RDI + 0xd0);
            local_48 = 0;
            local_140 = *(float *)*local_40;
            for (local_144 = 1; local_144 < local_100; local_144 = local_144 + 1) {
              local_50 = (long *)(in_RDI + 0x160);
              local_58 = (long)local_144;
              dVar7 = std::sqrt((double)(ulong)*(uint *)(*local_50 + local_58 * 4));
              local_148 = SUB84(dVar7,0);
              local_14c = (((local_140 * (float)local_f0) / (float)local_ec) * local_148) / 2.0;
              local_150 = (local_140 / local_148) / 2.0;
              *local_120 = local_124 - local_14c;
              local_120[1] = local_128 - local_150;
              local_120[2] = local_124 + local_14c;
              local_120[3] = local_128 + local_150;
              local_120 = local_120 + 4;
            }
            local_124 = local_f4 + local_124;
          }
        }
        if (*(int *)(in_RDI + 0x1bc) != 0) {
          local_98 = local_110;
          local_158 = local_110->data;
          for (local_15c = 0; local_15c < local_110->w; local_15c = local_15c + 1) {
            local_160 = 0.0;
            pfVar5 = std::max<float>((float *)((long)local_158 + (long)local_15c * 4),&local_160);
            local_164 = 1.0;
            pfVar5 = std::min<float>(pfVar5,&local_164);
            *(float *)((long)local_158 + (long)local_15c * 4) = *pfVar5;
          }
        }
        return 0;
      }
      return -100;
    }
  }
  local_168 = *(int *)(in_RDI + 0x1c0);
  local_16c = *(int *)(in_RDI + 0x1c4);
  if (local_168 == -0xe9) {
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_d8,1);
    local_168 = pvVar3->w;
  }
  if (local_16c == -0xe9) {
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_d8,1);
    local_16c = pvVar3->h;
  }
  local_170 = *(float *)(in_RDI + 0x1c8);
  local_174 = *(float *)(in_RDI + 0x1cc);
  if (((local_170 == -233.0) && (!NAN(local_170))) &&
     (local_170 = (float)local_168 / (float)local_ec, (*(byte *)(in_RDI + 0x1d4) & 1) != 0)) {
    dVar7 = std::ceil((double)(ulong)(uint)((float)local_168 / (float)local_ec));
    local_170 = SUB84(dVar7,0);
  }
  if (((local_174 == -233.0) && (!NAN(local_174))) &&
     (local_174 = (float)local_16c / (float)local_f0, (*(byte *)(in_RDI + 0x1d4) & 1) != 0)) {
    dVar7 = std::ceil((double)(ulong)(uint)((float)local_16c / (float)local_f0));
    local_174 = SUB84(dVar7,0);
  }
  local_178 = *(int *)(in_RDI + 0xfc);
  local_17c = *(int *)(in_RDI + 0x144);
  local_180 = *(int *)(in_RDI + 0x18c);
  local_184 = local_178 * local_180 + local_178 + local_17c;
  if (*(int *)(in_RDI + 0x1b8) != 0) {
    local_184 = local_178 * local_180 + local_184;
  }
  local_190 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_e0,0);
  Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
              (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),(int)in_stack_fffffffffffffde8,
              CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
              in_stack_fffffffffffffdd8);
  local_c0 = local_190;
  bVar6 = true;
  if (local_190->data != (void *)0x0) {
    local_8 = local_190;
    bVar6 = local_190->cstep * (long)local_190->c == 0;
  }
  if (bVar6) {
    local_c4 = -100;
  }
  else {
    for (local_194 = 0; local_194 < local_f0; local_194 = local_194 + 1) {
      local_a0 = local_190;
      local_1a0 = (float *)((long)local_190->data + (long)(local_194 * local_ec * local_184 * 4) * 4
                           );
      local_1a4 = *(float *)(in_RDI + 0x1d0) * local_170;
      local_1a8 = *(float *)(in_RDI + 0x1d0) * local_174 + (float)local_194 * local_174;
      if ((*(byte *)(in_RDI + 0x1d5) & 1) != 0) {
        local_1a4 = *(float *)(in_RDI + 0x1d0) * (local_170 - 1.0);
        local_1a8 = *(float *)(in_RDI + 0x1d0) * (local_174 - 1.0) + (float)local_194 * local_174;
      }
      for (local_1ac = 0; local_1ac < local_ec; local_1ac = local_1ac + 1) {
        for (local_1b8 = 0; local_1b8 < local_178; local_1b8 = local_1b8 + 1) {
          local_60 = (long *)(in_RDI + 0xd0);
          local_68 = (long)local_1b8;
          local_1bc = *(float *)(*local_60 + local_68 * 4);
          *local_1a0 = (local_1a4 - local_1bc * 0.5) / (float)local_168;
          local_1a0[1] = (local_1a8 - local_1bc * 0.5) / (float)local_16c;
          local_1a0[2] = (local_1a4 + local_1bc * 0.5) / (float)local_168;
          local_1a0[3] = (local_1a8 + local_1bc * 0.5) / (float)local_16c;
          local_1a0 = local_1a0 + 4;
          local_1b0 = local_1bc;
          if (0 < local_17c) {
            local_70 = (long *)(in_RDI + 0x118);
            local_78 = (long)local_1b8;
            local_1c0 = *(float *)(*local_70 + local_78 * 4);
            local_1b4 = local_1bc;
            dVar7 = std::sqrt((double)(ulong)(uint)(local_1bc * local_1c0));
            local_1b0 = SUB84(dVar7,0);
            *local_1a0 = (local_1a4 - local_1b0 * 0.5) / (float)local_168;
            local_1a0[1] = (local_1a8 - local_1b0 * 0.5) / (float)local_16c;
            local_1a0[2] = (local_1a4 + local_1b0 * 0.5) / (float)local_168;
            local_1a0[3] = (local_1a8 + local_1b0 * 0.5) / (float)local_16c;
            local_1a0 = local_1a0 + 4;
          }
          local_1b4 = local_1b0;
          for (local_1c4 = 0; fVar1 = local_1bc, local_1c4 < local_180; local_1c4 = local_1c4 + 1) {
            local_80 = (long *)(in_RDI + 0x160);
            local_88 = (long)local_1c4;
            local_1c8 = *(uint *)(*local_80 + local_88 * 4);
            dVar7 = std::sqrt((double)(ulong)local_1c8);
            fVar2 = local_1bc;
            local_1b0 = fVar1 * SUB84(dVar7,0);
            dVar7 = std::sqrt((double)(ulong)local_1c8);
            local_1b4 = fVar2 / SUB84(dVar7,0);
            *local_1a0 = (local_1a4 - local_1b0 * 0.5) / (float)local_168;
            local_1a0[1] = (local_1a8 - local_1b4 * 0.5) / (float)local_16c;
            local_1a0[2] = (local_1a4 + local_1b0 * 0.5) / (float)local_168;
            local_1a0[3] = (local_1a8 + local_1b4 * 0.5) / (float)local_16c;
            pfVar5 = local_1a0 + 4;
            if (*(int *)(in_RDI + 0x1b8) != 0) {
              local_1a0[4] = (local_1a4 - local_1b4 * 0.5) / (float)local_168;
              local_1a0[5] = (local_1a8 - local_1b0 * 0.5) / (float)local_16c;
              local_1a0[6] = (local_1a4 + local_1b4 * 0.5) / (float)local_168;
              local_1a0[7] = (local_1a8 + local_1b0 * 0.5) / (float)local_16c;
              pfVar5 = local_1a0 + 8;
            }
            local_1a0 = pfVar5;
          }
        }
        local_1a4 = local_170 + local_1a4;
      }
    }
    if (*(int *)(in_RDI + 0x1bc) != 0) {
      local_a8 = local_190;
      local_1d0 = local_190->data;
      for (local_1d4 = 0; local_1d4 < local_190->w; local_1d4 = local_1d4 + 1) {
        local_1d8 = 0.0;
        pfVar5 = std::max<float>((float *)((long)local_1d0 + (long)local_1d4 * 4),&local_1d8);
        local_1dc = 1.0;
        pfVar5 = std::min<float>(pfVar5,&local_1dc);
        *(float *)((long)local_1d0 + (long)local_1d4 * 4) = *pfVar5;
      }
    }
    local_1e8 = (undefined4 *)((long)local_190->data + (long)local_190->w * local_190->elemsize);
    for (local_1ec = 0; local_1ec < local_190->w / 4; local_1ec = local_1ec + 1) {
      *local_1e8 = *(undefined4 *)(in_RDI + 0x1a8);
      local_1e8[1] = *(undefined4 *)(in_RDI + 0x1ac);
      local_1e8[2] = *(undefined4 *)(in_RDI + 0x1b0);
      local_1e8[3] = *(undefined4 *)(in_RDI + 0x1b4);
      local_1e8 = local_1e8 + 4;
    }
    local_c4 = 0;
  }
  return local_c4;
}

Assistant:

int PriorBox::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int w = bottom_blobs[0].w;
    int h = bottom_blobs[0].h;

    if (bottom_blobs.size() == 1 && image_width == -233 && image_height == -233 && max_sizes.empty())
    {
        // mxnet style _contrib_MultiBoxPrior
        float step_w = step_width;
        float step_h = step_height;
        if (step_w == -233)
            step_w = 1.f / (float)w;
        if (step_h == -233)
            step_h = 1.f / (float)h;

        int num_sizes = min_sizes.w;
        int num_ratios = aspect_ratios.w;

        int num_prior = num_sizes - 1 + num_ratios;

        Mat& top_blob = top_blobs[0];
        top_blob.create(4 * w * h * num_prior, 4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* box = (float*)top_blob + i * w * num_prior * 4;

            float center_x = offset * step_w;
            float center_y = offset * step_h + i * step_h;

            for (int j = 0; j < w; j++)
            {
                // ratio = 1, various sizes
                for (int k = 0; k < num_sizes; k++)
                {
                    float size = min_sizes[k];
                    float cw = size * h / w / 2;
                    float ch = size / 2;

                    box[0] = center_x - cw;
                    box[1] = center_y - ch;
                    box[2] = center_x + cw;
                    box[3] = center_y + ch;
                    box += 4;
                }

                // various ratios, size = min_size = size[0]
                float size = min_sizes[0];
                for (int p = 1; p < num_ratios; p++)
                {
                    float ratio = static_cast<float>(sqrt(aspect_ratios[p]));
                    float cw = size * h / w * ratio / 2;
                    float ch = size / ratio / 2;

                    box[0] = center_x - cw;
                    box[1] = center_y - ch;
                    box[2] = center_x + cw;
                    box[3] = center_y + ch;
                    box += 4;
                }

                center_x += step_w;
            }
        }

        if (clip)
        {
            float* box = top_blob;
            for (int i = 0; i < top_blob.w; i++)
            {
                box[i] = std::min(std::max(box[i], 0.f), 1.f);
            }
        }

        return 0;
    }

    int image_w = image_width;
    int image_h = image_height;
    if (image_w == -233)
        image_w = bottom_blobs[1].w;
    if (image_h == -233)
        image_h = bottom_blobs[1].h;

    float step_w = step_width;
    float step_h = step_height;
    if (step_w == -233)
    {
        step_w = (float)image_w / w;
        if (step_mmdetection)
            step_w = static_cast<float>(ceil((float)image_w / w));
    }
    if (step_h == -233)
    {
        step_h = (float)image_h / h;
        if (step_mmdetection)
            step_h = static_cast<float>(ceil((float)image_h / h));
    }

    int num_min_size = min_sizes.w;
    int num_max_size = max_sizes.w;
    int num_aspect_ratio = aspect_ratios.w;

    int num_prior = num_min_size * num_aspect_ratio + num_min_size + num_max_size;
    if (flip)
        num_prior += num_min_size * num_aspect_ratio;

    Mat& top_blob = top_blobs[0];
    top_blob.create(4 * w * h * num_prior, 2, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < h; i++)
    {
        float* box = (float*)top_blob + i * w * num_prior * 4;

        float center_x = offset * step_w;
        float center_y = offset * step_h + i * step_h;
        if (center_mmdetection)
        {
            center_x = offset * (step_w - 1);
            center_y = offset * (step_h - 1) + i * step_h;
        }

        for (int j = 0; j < w; j++)
        {
            float box_w;
            float box_h;

            for (int k = 0; k < num_min_size; k++)
            {
                float min_size = min_sizes[k];

                // min size box
                box_w = box_h = min_size;

                box[0] = (center_x - box_w * 0.5f) / image_w;
                box[1] = (center_y - box_h * 0.5f) / image_h;
                box[2] = (center_x + box_w * 0.5f) / image_w;
                box[3] = (center_y + box_h * 0.5f) / image_h;

                box += 4;

                if (num_max_size > 0)
                {
                    float max_size = max_sizes[k];

                    // max size box
                    box_w = box_h = static_cast<float>(sqrt(min_size * max_size));

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;
                }

                // all aspect_ratios
                for (int p = 0; p < num_aspect_ratio; p++)
                {
                    float ar = aspect_ratios[p];

                    box_w = static_cast<float>(min_size * sqrt(ar));
                    box_h = static_cast<float>(min_size / sqrt(ar));

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;

                    if (flip)
                    {
                        box[0] = (center_x - box_h * 0.5f) / image_w;
                        box[1] = (center_y - box_w * 0.5f) / image_h;
                        box[2] = (center_x + box_h * 0.5f) / image_w;
                        box[3] = (center_y + box_w * 0.5f) / image_h;

                        box += 4;
                    }
                }
            }

            center_x += step_w;
        }
    }

    if (clip)
    {
        float* box = top_blob;
        for (int i = 0; i < top_blob.w; i++)
        {
            box[i] = std::min(std::max(box[i], 0.f), 1.f);
        }
    }

    // set variance
    float* var = top_blob.row(1);
    for (int i = 0; i < top_blob.w / 4; i++)
    {
        var[0] = variances[0];
        var[1] = variances[1];
        var[2] = variances[2];
        var[3] = variances[3];

        var += 4;
    }

    return 0;
}